

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

void duckdb::TernaryExecutor::
     ExecuteLoop<duckdb::interval_t,duckdb::date_t,duckdb::interval_t,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(duckdb::interval_t,duckdb::date_t,duckdb::interval_t)>
               (interval_t *adata,date_t *bdata,interval_t *cdata,date_t *result_data,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
               ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
               ValidityMask *result_validity,_func_date_t_interval_t_date_t_interval_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  date_t dVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t i;
  ulong uVar13;
  idx_t row_idx;
  ulong uVar14;
  idx_t row_idx_00;
  idx_t row_idx_01;
  idx_t i_1;
  idx_t row_idx_02;
  interval_t iVar15;
  interval_t iVar16;
  interval_t iVar17;
  interval_t iVar18;
  
  if ((((avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
        (unsigned_long *)0x0) &&
      ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      )) && ((cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
             (unsigned_long *)0x0)) {
    for (uVar13 = 0; count != uVar13; uVar13 = uVar13 + 1) {
      uVar11 = uVar13;
      if (asel->sel_vector != (sel_t *)0x0) {
        uVar11 = (ulong)asel->sel_vector[uVar13];
      }
      uVar12 = uVar13;
      if (bsel->sel_vector != (sel_t *)0x0) {
        uVar12 = (ulong)bsel->sel_vector[uVar13];
      }
      uVar14 = uVar13;
      if (csel->sel_vector != (sel_t *)0x0) {
        uVar14 = (ulong)csel->sel_vector[uVar13];
      }
      uVar1 = adata[uVar11].months;
      uVar5 = adata[uVar11].days;
      iVar15.days = uVar5;
      iVar15.months = uVar1;
      uVar2 = cdata[uVar14].months;
      uVar6 = cdata[uVar14].days;
      iVar17.days = uVar6;
      iVar17.months = uVar2;
      iVar15.micros = adata[uVar11].micros;
      iVar17.micros = cdata[uVar14].micros;
      dVar10 = (*fun)(iVar15,bdata[uVar12].days,iVar17);
      result_data[uVar13].days = dVar10.days;
    }
  }
  else {
    for (row_idx_02 = 0; count != row_idx_02; row_idx_02 = row_idx_02 + 1) {
      row_idx_00 = row_idx_02;
      if (asel->sel_vector != (sel_t *)0x0) {
        row_idx_00 = (idx_t)asel->sel_vector[row_idx_02];
      }
      row_idx = row_idx_02;
      if (bsel->sel_vector != (sel_t *)0x0) {
        row_idx = (idx_t)bsel->sel_vector[row_idx_02];
      }
      row_idx_01 = row_idx_02;
      if (csel->sel_vector != (sel_t *)0x0) {
        row_idx_01 = (idx_t)csel->sel_vector[row_idx_02];
      }
      bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
      if (bVar9) {
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
        if (!bVar9) goto LAB_00c9da06;
        bVar9 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_01);
        if (!bVar9) goto LAB_00c9da06;
        uVar3 = adata[row_idx_00].months;
        uVar7 = adata[row_idx_00].days;
        iVar16.days = uVar7;
        iVar16.months = uVar3;
        uVar4 = cdata[row_idx_01].months;
        uVar8 = cdata[row_idx_01].days;
        iVar18.days = uVar8;
        iVar18.months = uVar4;
        iVar16.micros = adata[row_idx_00].micros;
        iVar18.micros = cdata[row_idx_01].micros;
        dVar10 = (*fun)(iVar16,bdata[row_idx].days,iVar18);
        result_data[row_idx_02].days = dVar10.days;
      }
      else {
LAB_00c9da06:
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&result_validity->super_TemplatedValidityMask<unsigned_long>,row_idx_02);
      }
    }
  }
  return;
}

Assistant:

static inline void ExecuteLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, ValidityMask &result_validity, FUN fun) {
		if (!avalidity.AllValid() || !bvalidity.AllValid() || !cvalidity.AllValid()) {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				if (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx)) {
					result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
					    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
				} else {
					result_validity.SetInvalid(i);
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto aidx = asel.get_index(i);
				auto bidx = bsel.get_index(i);
				auto cidx = csel.get_index(i);
				result_data[i] = OPWRAPPER::template Operation<FUN, A_TYPE, B_TYPE, C_TYPE, RESULT_TYPE>(
				    fun, adata[aidx], bdata[bidx], cdata[cidx], result_validity, i);
			}
		}
	}